

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O3

int run_test_eintr_handling(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  int64_t eval_b_3;
  int64_t eval_a_3;
  uv_thread_t thread;
  thread_ctx ctx;
  uv_signal_t signal;
  undefined8 local_b0;
  long local_a8 [5];
  undefined1 local_80 [120];
  
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_signal_init(loop,local_80);
  local_a8[0] = (long)iVar2;
  local_b0 = 0;
  if (local_a8[0] == 0) {
    iVar2 = uv_signal_start(local_80,sig_func,10);
    local_a8[0] = (long)iVar2;
    local_b0 = 0;
    if (local_a8[0] != 0) goto LAB_0018569f;
    iVar2 = pipe(pipe_fds);
    local_a8[0] = (long)iVar2;
    local_b0 = 0;
    if (local_a8[0] != 0) goto LAB_001856ae;
    iVar2 = uv_thread_create(&local_b0,thread_main,local_a8);
    if (iVar2 != 0) goto LAB_001856bd;
    iVar2 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,0xffffffffffffffff,0);
    if (iVar2 != 0xd) goto LAB_001856cc;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_001856db;
    iVar2 = uv_run(loop,0);
    if (iVar2 != 0) goto LAB_001856ea;
    iVar2 = close(pipe_fds[0]);
    if (iVar2 != 0) goto LAB_001856f9;
    iVar2 = close(pipe_fds[1]);
    if (iVar2 != 0) goto LAB_00185708;
    uv_close(local_80,0);
    iVar2 = uv_thread_join(&local_b0);
    puVar1 = loop;
    if (iVar2 == 0) {
      uv_walk(loop,close_walk_cb,0);
      uv_run(puVar1,0);
      iVar2 = uv_loop_close(loop);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto <EXTERNAL>_uv_signal_stop;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_0018569f:
    run_test_eintr_handling_cold_2();
LAB_001856ae:
    run_test_eintr_handling_cold_3();
LAB_001856bd:
    run_test_eintr_handling_cold_4();
LAB_001856cc:
    run_test_eintr_handling_cold_5();
LAB_001856db:
    run_test_eintr_handling_cold_6();
LAB_001856ea:
    run_test_eintr_handling_cold_7();
LAB_001856f9:
    run_test_eintr_handling_cold_8();
LAB_00185708:
    run_test_eintr_handling_cold_9();
  }
  run_test_eintr_handling_cold_10();
<EXTERNAL>_uv_signal_stop:
  run_test_eintr_handling_cold_11();
  iVar2 = uv_signal_stop();
  return iVar2;
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT_OK(uv_signal_init(loop, &signal));
  ASSERT_OK(uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT_OK(pipe(pipe_fds));
  ASSERT_OK(uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT_EQ(nread, sizeof(test_buf));
  ASSERT_OK(strcmp(buf, test_buf));

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_OK(close(pipe_fds[0]));
  ASSERT_OK(close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  ASSERT_OK(uv_thread_join(&thread));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}